

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O2

BOOL __thiscall
Js::TypedArray<unsigned_int,_false,_true>::DirectSetItem
          (TypedArray<unsigned_int,_false,_true> *this,uint32 index,Var value)

{
  BOOL BVar1;
  
  BVar1 = BaseTypedDirectSetItem(this,index,value,JavascriptConversion::ToUInt32);
  return BVar1;
}

Assistant:

inline BOOL Uint32VirtualArray::DirectSetItem(__in uint32 index, __in Js::Var value)
    {
        return BaseTypedDirectSetItem(index, value, JavascriptConversion::ToUInt32);
    }